

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdma.cc
# Opt level: O2

void __thiscall
bsplib::Rdma::get(Rdma *this,int src_pid,Memslot src_slot,size_t src_offset,void *dst,size_t size)

{
  pointer ppvVar1;
  pointer ppvVar2;
  void *dst_local;
  TicToc t;
  Action action;
  
  dst_local = dst;
  TicToc::TicToc(&t,GET,0);
  if (((this->m_used_slots).
       super__Vector_base<bsplib::Rdma::Memblock,_std::allocator<bsplib::Rdma::Memblock>_>._M_impl.
       super__Vector_impl_data._M_start[(long)this->m_nprocs * src_slot + (long)this->m_pid].status
      & 1) == 0) {
    ppvVar1 = (this->m_local_slots).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppvVar2 = (this->m_local_slots).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    std::vector<void_*,_std::allocator<void_*>_>::push_back(&this->m_local_slots,&dst_local);
    action.dst_slot = (long)ppvVar2 - (long)ppvVar1 >> 3;
    action.kind = GET;
    action.dst_pid = this->m_pid;
    action.tag = 0;
    action.target_pid = src_pid;
    action.src_pid = src_pid;
    action.src_slot = src_slot;
    action.offset = src_offset;
    action.size = size;
    ActionBuf::push_back(&this->m_send_actions,&action);
    TicToc::~TicToc(&t);
    return;
  }
  __assert_fail("!( slot( m_pid, src_slot ).status & Memblock::PUSHED)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/src/rdma.cc"
                ,0x7a,"void bsplib::Rdma::get(int, Memslot, size_t, void *, size_t)");
}

Assistant:

void Rdma::get( int src_pid, Memslot src_slot, size_t src_offset,
        void * dst, size_t size )
{
#ifdef PROFILE
    TicToc t( TicToc::GET );
#endif
    assert( !( slot( m_pid, src_slot ).status & Memblock::PUSHED) );

    Memslot dst_slot = m_local_slots.size();
    m_local_slots.push_back( dst );

    Action action = { Action::GET, src_pid, src_pid, m_pid, 
                      0, src_slot, dst_slot, src_offset, size  };
    m_send_actions.push_back( action );
}